

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_merge_sort_tree.cpp
# Opt level: O1

void __thiscall duckdb::WindowMergeSortTreeLocalState::Sort(WindowMergeSortTreeLocalState *this)

{
  PartitionSortStage PVar1;
  bool bVar2;
  
  PVar1 = (this->window_tree->build_stage)._M_i;
  while (PVar1 != FINISHED) {
    bVar2 = WindowMergeSortTree::TryPrepareSortStage(this->window_tree,this);
    if (bVar2) {
      ExecuteSortTask(this);
    }
    else {
      sched_yield();
    }
    PVar1 = (this->window_tree->build_stage)._M_i;
  }
  return;
}

Assistant:

void WindowMergeSortTreeLocalState::Sort() {
	// Sort, merge and build the tree in parallel
	while (window_tree.build_stage.load() != PartitionSortStage::FINISHED) {
		if (window_tree.TryPrepareSortStage(*this)) {
			ExecuteSortTask();
		} else {
			std::this_thread::yield();
		}
	}
}